

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O2

boolean read_quant_tables(j_compress_ptr cinfo,char *filename,boolean force_baseline)

{
  boolean bVar1;
  FILE *__stream;
  long lVar2;
  char *__format;
  ulong uVar3;
  int termchar;
  long val;
  uint table [64];
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    bVar1 = 0;
    fprintf(_stderr,"Can\'t open table file %s\n",filename);
  }
  else {
    uVar3 = 0;
    while( true ) {
      bVar1 = read_text_integer((FILE *)__stream,&val,&termchar);
      if (bVar1 == 0) break;
      if (uVar3 == 4) {
        __format = "Too many tables in file %s\n";
        goto LAB_001038ea;
      }
      table[0] = (uint)val;
      for (lVar2 = 1; lVar2 != 0x40; lVar2 = lVar2 + 1) {
        bVar1 = read_text_integer((FILE *)__stream,&val,&termchar);
        if (bVar1 == 0) {
          __format = "Invalid table data in file %s\n";
          goto LAB_001038ea;
        }
        table[lVar2] = (uint)val;
      }
      jpeg_add_quant_table(cinfo,uVar3 & 0xffffffff,table,q_scale_factor[uVar3],force_baseline);
      uVar3 = uVar3 + 1;
    }
    if (termchar == -1) {
      fclose(__stream);
      bVar1 = 1;
    }
    else {
      __format = "Non-numeric data in file %s\n";
LAB_001038ea:
      bVar1 = 0;
      fprintf(_stderr,__format,filename);
      fclose(__stream);
    }
  }
  return bVar1;
}

Assistant:

GLOBAL(boolean)
read_quant_tables(j_compress_ptr cinfo, char *filename, boolean force_baseline)
/* Read a set of quantization tables from the specified file.
 * The file is plain ASCII text: decimal numbers with whitespace between.
 * Comments preceded by '#' may be included in the file.
 * There may be one to NUM_QUANT_TBLS tables in the file, each of 64 values.
 * The tables are implicitly numbered 0,1,etc.
 * NOTE: does not affect the qslots mapping, which will default to selecting
 * table 0 for luminance (or primary) components, 1 for chrominance components.
 * You must use -qslots if you want a different component->table mapping.
 */
{
  FILE *fp;
  int tblno, i, termchar;
  long val;
  unsigned int table[DCTSIZE2];

  if ((fp = fopen(filename, "r")) == NULL) {
    fprintf(stderr, "Can't open table file %s\n", filename);
    return FALSE;
  }
  tblno = 0;

  while (read_text_integer(fp, &val, &termchar)) { /* read 1st element of table */
    if (tblno >= NUM_QUANT_TBLS) {
      fprintf(stderr, "Too many tables in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    table[0] = (unsigned int)val;
    for (i = 1; i < DCTSIZE2; i++) {
      if (!read_text_integer(fp, &val, &termchar)) {
        fprintf(stderr, "Invalid table data in file %s\n", filename);
        fclose(fp);
        return FALSE;
      }
      table[i] = (unsigned int)val;
    }
#if JPEG_LIB_VERSION >= 70
    jpeg_add_quant_table(cinfo, tblno, table, cinfo->q_scale_factor[tblno],
                         force_baseline);
#else
    jpeg_add_quant_table(cinfo, tblno, table, q_scale_factor[tblno],
                         force_baseline);
#endif
    tblno++;
  }

  if (termchar != EOF) {
    fprintf(stderr, "Non-numeric data in file %s\n", filename);
    fclose(fp);
    return FALSE;
  }

  fclose(fp);
  return TRUE;
}